

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::LoadableGetStateBlock_x(ChElementBeamANCF_3333 *this)

{
  ChState *in_RDX;
  int in_ESI;
  
  LoadableGetStateBlock_x
            ((ChElementBeamANCF_3333 *)
             ((this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[-6] +
             (long)&(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                    _vptr_ChElementBase),in_ESI,in_RDX);
  return;
}

Assistant:

void ChElementBeamANCF_3333::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = m_nodes[0]->GetD().eigen();
    mD.segment(block_offset + 6, 3) = m_nodes[0]->GetDD().eigen();

    mD.segment(block_offset + 9, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 12, 3) = m_nodes[1]->GetD().eigen();
    mD.segment(block_offset + 15, 3) = m_nodes[1]->GetDD().eigen();

    mD.segment(block_offset + 18, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(block_offset + 21, 3) = m_nodes[2]->GetD().eigen();
    mD.segment(block_offset + 24, 3) = m_nodes[2]->GetDD().eigen();
}